

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_1f0116::TfFinder::handleToken(TfFinder *this,Token *token)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  char *__nptr;
  size_type sVar4;
  double dVar5;
  allocator<char> local_79;
  string local_78;
  unsigned_long local_58 [3];
  string local_40 [8];
  string value;
  token_type_e ttype;
  Token *token_local;
  TfFinder *this_local;
  
  value.field_2._12_4_ = QPDFTokenizer::Token::getType(token);
  psVar3 = QPDFTokenizer::Token::getValue_abi_cxx11_(token);
  std::__cxx11::string::string(local_40,(string *)psVar3);
  psVar3 = QPDFTokenizer::Token::getRawValue_abi_cxx11_(token);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->DA,psVar3);
  switch(value.field_2._12_4_) {
  case 7:
  case 9:
    __nptr = (char *)std::__cxx11::string::c_str();
    dVar5 = strtod(__nptr,(char **)0x0);
    this->last_num = dVar5;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->DA);
    local_58[0] = sVar4 - 1;
    iVar2 = QIntC::to_int<unsigned_long>(local_58);
    this->last_num_idx = iVar2;
    break;
  case 8:
    std::__cxx11::string::operator=((string *)&this->last_name,local_40);
    break;
  default:
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Tf",&local_79);
    bVar1 = QPDFTokenizer::Token::isWord(token,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    if (bVar1) {
      if ((1.0 < this->last_num) && (this->last_num <= 1000.0 && this->last_num != 1000.0)) {
        this->tf = this->last_num;
      }
      this->tf_idx = this->last_num_idx;
      std::__cxx11::string::operator=((string *)&this->font_name,(string *)&this->last_name);
    }
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void
TfFinder::handleToken(QPDFTokenizer::Token const& token)
{
    QPDFTokenizer::token_type_e ttype = token.getType();
    std::string value = token.getValue();
    DA.push_back(token.getRawValue());
    switch (ttype) {
    case QPDFTokenizer::tt_integer:
    case QPDFTokenizer::tt_real:
        last_num = strtod(value.c_str(), nullptr);
        last_num_idx = QIntC::to_int(DA.size() - 1);
        break;

    case QPDFTokenizer::tt_name:
        last_name = value;
        break;

    case QPDFTokenizer::tt_word:
        if (token.isWord("Tf")) {
            if ((last_num > 1.0) && (last_num < 1000.0)) {
                // These ranges are arbitrary but keep us from doing insane things or suffering from
                // over/underflow
                tf = last_num;
            }
            tf_idx = last_num_idx;
            font_name = last_name;
        }
        break;

    default:
        break;
    }
}